

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O3

bool Search::might_print_update(vw *all)

{
  shared_data *psVar1;
  
  psVar1 = all->sd;
  if (((double)psVar1->dump_interval <=
       psVar1->weighted_labeled_examples + psVar1->weighted_unlabeled_examples + 1.0) &&
     (all->quiet == false)) {
    return (bool)(all->bfgs ^ 1);
  }
  return false;
}

Assistant:

bool might_print_update(vw& all)
{
  // basically do should_print_update but check me and the next
  // example because of off-by-ones

  if (PRINT_UPDATE_EVERY_EXAMPLE)
    return true;
  if (PRINT_UPDATE_EVERY_PASS)
    return true;  // SPEEDUP: make this better
  return (all.sd->weighted_examples() + 1. >= all.sd->dump_interval) && !all.quiet && !all.bfgs;
}